

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::GeometryShaderMaxOutputComponentsTest
          (GeometryShaderMaxOutputComponentsTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderMaxOutputComponentsTest *this_local;
  
  GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase
            (&this->super_GeometryShaderLimitsRenderingBase,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxOutputComponentsTest_0325fae0;
  std::__cxx11::string::string((string *)&this->m_fragment_shader_code);
  std::__cxx11::string::string((string *)&this->m_geometry_shader_code);
  this->m_texture_width = 0;
  this->m_max_output_components = 0;
  this->m_max_output_vectors = 0;
  this->m_max_total_output_components = 0;
  this->m_n_available_vectors = 0;
  this->m_n_output_points = 0;
  return;
}

Assistant:

GeometryShaderMaxOutputComponentsTest::GeometryShaderMaxOutputComponentsTest(Context&			  context,
																			 const ExtParameters& extParams,
																			 const char* name, const char* description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_texture_width(0)
	, m_max_output_components(0)
	, m_max_output_vectors(0)
	, m_max_total_output_components(0)
	, m_n_available_vectors(0)
	, m_n_output_points(0)
{
	/* Nothing to be done here */
}